

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsummaryxreftobin.cpp
# Opt level: O2

void doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  fmsummaryxref s;
  char line [4096];
  
  fgets(line,0x1000,_stdin);
  uVar3 = 1;
  while( true ) {
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(line,"%d,%d,%d",&s,&s.summary_id,&s.summaryset_id);
    if (iVar1 != 3) break;
    fwrite(&s,0xc,1,_stdout);
    uVar3 = uVar3 + 1;
  }
  fprintf(_stderr,"Invalid data in line %d:\n%s",(ulong)uVar3,line);
  return;
}

Assistant:

void doit()
{

	fmsummaryxref s;
    char line[4096];
    int lineno=0;
	fgets(line, sizeof(line), stdin);
	lineno++;
    while (fgets(line, sizeof(line), stdin) != 0)
    {
		if (sscanf(line, "%d,%d,%d", &s.output_id, &s.summary_id, &s.summaryset_id) != 3){
           fprintf(stderr, "Invalid data in line %d:\n%s", lineno, line);
           return;
       }

	    else
       {
           fwrite(&s, sizeof(s), 1, stdout);
       }
       lineno++;
    }

}